

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.hpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test8::_argument_list_tree_node::~_argument_list_tree_node
          (_argument_list_tree_node *this)

{
  _argument_list_tree_node *this_00;
  size_type sVar1;
  reference pp_Var2;
  _argument_list_tree_node *node_ptr;
  _argument_list_tree_node *this_local;
  
  while (sVar1 = std::
                 vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                 ::size(&this->children), sVar1 != 0) {
    pp_Var2 = std::
              vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ::back(&this->children);
    this_00 = *pp_Var2;
    std::
    vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
    ::pop_back(&this->children);
    if (this_00 != (_argument_list_tree_node *)0x0) {
      ~_argument_list_tree_node(this_00);
      operator_delete(this_00,0x30);
    }
  }
  std::
  vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::~vector(&this->children);
  return;
}

Assistant:

~_argument_list_tree_node()
		{
			while (children.size() > 0)
			{
				_argument_list_tree_node* node_ptr = children.back();

				children.pop_back();

				delete node_ptr;
				node_ptr = NULL;
			}
		}